

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

ParsedRfcDateTime rfcDateImpl(QStringView s)

{
  storage_type_conflict sVar1;
  long lVar2;
  anon_class_1_0_00000001 *this;
  void *pvVar3;
  storage_type_conflict *psVar4;
  bool bVar5;
  int iVar6;
  Category CVar7;
  qsizetype qVar8;
  qlonglong qVar9;
  qlonglong qVar10;
  ulong uVar11;
  storage_type_conflict *extraout_RDX;
  int iVar12;
  uint uVar13;
  long lVar14;
  int base;
  undefined8 in_R8;
  ulong uVar16;
  storage_type_conflict *psVar17;
  QDate QVar18;
  int iVar19;
  uint uVar20;
  long in_FS_OFFSET;
  QStringView string;
  QStringView string_00;
  QStringView name;
  QStringView string_01;
  QStringView string_02;
  QStringView string_03;
  QStringView string_04;
  QStringView string_05;
  QStringView name_00;
  QStringView monthName;
  ParsedRfcDateTime PVar21;
  QStringView needle0;
  QStringView needle0_00;
  bool ok;
  iterator it;
  uint local_130;
  QDate local_118;
  byte local_109;
  undefined1 local_108 [32];
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  undefined1 *local_d8;
  QStringTokenizerBase<QStringView,_QChar> local_d0;
  QVLABase<QStringView> local_b0;
  QStringView local_98;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  QDate *pQVar15;
  
  local_d0.m_haystack.m_data = s.m_data;
  local_d0.m_haystack.m_size = s.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  local_b0.super_QVLABaseBase.a = 6;
  local_b0.super_QVLABaseBase.s = 0;
  local_d0.super_QStringTokenizerBaseBase.m_sb.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
  super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
       (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x1;
  local_d0.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
  local_d0.m_needle.ucs = L' ';
  local_d0._26_6_ = 0xaaaaaaaaaaaa;
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
  local_108._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_108._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_108._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_108._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b0.super_QVLABaseBase.ptr = &local_98;
  QStringTokenizerBase<QStringView,_QChar>::iterator::iterator((iterator *)local_108,&local_d0);
  iVar12 = 6;
  do {
    base = (int)in_R8;
    if (local_108[0x18] == false) break;
    QVLABase<QStringView>::emplace_back_impl<QStringView_const&>
              (&local_b0,6,&local_98,(QStringView *)(local_108 + 8));
    QStringTokenizerBase<QStringView,_QChar>::iterator::advance((iterator *)local_108);
    base = (int)in_R8;
    iVar12 = iVar12 + -1;
  } while (iVar12 != 0);
  pvVar3 = local_b0.super_QVLABaseBase.ptr;
  QVar18.jd = -0x8000000000000000;
  uVar16 = 0xffffffff;
  if ((local_b0.super_QVLABaseBase.s < 3) || (local_108[0x18] != false)) {
    uVar11 = 0;
    goto LAB_003467cc;
  }
  local_109 = 1;
  lVar14 = *(qsizetype *)local_b0.super_QVLABaseBase.ptr;
  psVar17 = *(storage_type_conflict **)((long)local_b0.super_QVLABaseBase.ptr + 8);
  if ((lVar14 == 0) || (psVar17[lVar14 + -1] != L',')) {
    sVar1 = *psVar17;
    lVar2 = 0;
    psVar4 = (storage_type_conflict *)0x0;
    if ((ushort)sVar1 - 0x30 < 10) goto LAB_00346404;
    if (0x7f < (ushort)sVar1) {
      CVar7 = QChar::category((uint)(ushort)sVar1);
      lVar2 = 0;
      psVar4 = (storage_type_conflict *)0x0;
      if (CVar7 == Number_DecimalDigit) goto LAB_00346404;
    }
    QVLABase<QStringView>::erase
              (&local_b0,(const_iterator)pvVar3,(const_iterator)((long)pvVar3 + 0x10));
    if (0xfffffffffffffffc < local_b0.super_QVLABaseBase.s - 6U) {
      if ((ulong)local_b0.super_QVLABaseBase.s < 4) {
        local_130 = 2;
      }
      else {
        pQVar15 = &local_118;
        local_118.jd._0_2_ = 0x3a;
        needle0.m_data = (storage_type_conflict *)pQVar15;
        needle0.m_size = 1;
        qVar8 = QtPrivate::findString
                          (*(QStringView *)((long)local_b0.super_QVLABaseBase.ptr + 0x20),0,needle0,
                           CaseSensitive);
        base = (int)pQVar15;
        local_130 = qVar8 == -1 ^ 3;
      }
      iVar12 = 0;
      iVar19 = 1;
      goto LAB_003464ea;
    }
LAB_003467c6:
    uVar11 = 0;
    uVar13 = 0xffffffff;
  }
  else {
    QVLABase<QStringView>::erase
              (&local_b0,(const_iterator)local_b0.super_QVLABaseBase.ptr,
               (const_iterator)((long)local_b0.super_QVLABaseBase.ptr + 0x10));
    lVar2 = lVar14 + -1;
    psVar4 = psVar17;
LAB_00346404:
    psVar17 = psVar4;
    lVar14 = lVar2;
    uVar11 = 0;
    iVar19 = 0;
    uVar13 = 0xffffffff;
    if (0xfffffffffffffffc < local_b0.super_QVLABaseBase.s - 6U) {
      local_130 = 2;
      iVar12 = 1;
LAB_003464ea:
      iVar6 = 0;
      if (lVar14 == 0) {
LAB_00346630:
        string.m_data = (storage_type_conflict *)&local_109;
        string.m_size =
             *(qsizetype *)
              ((long)((long)local_b0.super_QVLABaseBase.ptr + 8) + (ulong)(uint)(iVar19 << 4));
        qVar9 = QString::toIntegral_helper
                          (*(QString **)
                            ((long)(qsizetype *)local_b0.super_QVLABaseBase.ptr +
                            (ulong)(uint)(iVar19 << 4)),string,(bool *)0xa,base);
        if (((int)qVar9 == qVar9) && ((local_109 & 1) != 0)) {
          string_00.m_data = (storage_type_conflict *)&local_109;
          string_00.m_size =
               *(qsizetype *)
                ((long)((long)local_b0.super_QVLABaseBase.ptr + 8) + (ulong)(local_130 << 4));
          qVar10 = QString::toIntegral_helper
                             (*(QString **)
                               ((long)(qsizetype *)local_b0.super_QVLABaseBase.ptr +
                               (ulong)(local_130 << 4)),string_00,(bool *)0xa,base);
          if (((int)qVar10 == qVar10) && ((local_109 & 1) != 0)) {
            this = *(anon_class_1_0_00000001 **)
                    ((long)(qsizetype *)local_b0.super_QVLABaseBase.ptr + (ulong)(uint)(iVar12 << 4)
                    );
            psVar17 = *(storage_type_conflict **)
                       ((long)((long)local_b0.super_QVLABaseBase.ptr + 8) +
                       (ulong)(uint)(iVar12 << 4));
            name.m_data = extraout_RDX;
            name.m_size = (qsizetype)psVar17;
            bVar5 = rfcDateImpl::anon_class_1_0_00000001::operator()(this,name);
            if (bVar5) {
              monthName.m_data = psVar17;
              monthName.m_size = (qsizetype)this;
              iVar12 = fromShortMonthName(monthName);
              lVar14 = QVar18.jd;
              if (-1 < iVar12) {
                QDate::QDate(&local_118,(int)qVar10,iVar12,(int)qVar9);
                lVar14 = CONCAT44(local_118.jd._4_4_,
                                  CONCAT22(local_118.jd._2_2_,(undefined2)local_118.jd));
                if (iVar6 != 0) {
                  iVar12 = 0;
                  if (lVar14 + 0xb69eeff91fU < 0x16d3e147974) {
                    iVar12 = QGregorianCalendar::weekDayOfJulian(lVar14);
                  }
                  if (iVar12 != iVar6) {
                    lVar14 = -0x8000000000000000;
                  }
                }
              }
              goto LAB_00346559;
            }
          }
        }
      }
      else {
        if ((((lVar14 != 3) ||
             ((sVar1 = *psVar17, 0x19 < (ushort)sVar1 - 0x41 &&
              (((ushort)sVar1 < 0x80 ||
               (CVar7 = QChar::category((uint)(ushort)sVar1), CVar7 != Letter_Uppercase)))))) ||
            ((sVar1 = psVar17[1], 0x19 < (ushort)sVar1 - 0x61 &&
             (((ushort)sVar1 < 0x80 ||
              (CVar7 = QChar::category((uint)(ushort)sVar1), CVar7 != Letter_Lowercase)))))) ||
           ((sVar1 = psVar17[2], 0x19 < (ushort)sVar1 - 0x61 &&
            (((ushort)sVar1 < 0x80 ||
             (CVar7 = QChar::category((uint)(ushort)sVar1), CVar7 != Letter_Lowercase))))))
        goto LAB_003467c6;
        name_00.m_data = psVar17;
        name_00.m_size = 3;
        iVar6 = shortDayFromName(name_00);
        lVar14 = -0x8000000000000000;
        if (iVar6 != 0) goto LAB_00346630;
LAB_00346559:
        QVLABase<QStringView>::erase
                  (&local_b0,
                   (const_iterator)
                   ((long)(qsizetype *)local_b0.super_QVLABaseBase.ptr + (ulong)(local_130 << 4)),
                   (const_iterator)
                   ((long)&((QStringView *)((long)local_b0.super_QVLABaseBase.ptr + 0x10))->m_size +
                   (ulong)(local_130 << 4)));
        QVLABase<QStringView>::erase
                  (&local_b0,(const_iterator)local_b0.super_QVLABaseBase.ptr,
                   (const_iterator)((long)local_b0.super_QVLABaseBase.ptr + 0x20));
        pvVar3 = local_b0.super_QVLABaseBase.ptr;
        uVar13 = 0xffffffff;
        if (local_b0.super_QVLABaseBase.s == 0) {
LAB_003469c3:
          uVar11 = 0;
          QVar18.jd = lVar14;
          goto LAB_003467c9;
        }
        pQVar15 = &local_118;
        local_118.jd._0_2_ = 0x3a;
        lVar2 = *(qsizetype *)local_b0.super_QVLABaseBase.ptr;
        psVar17 = *(storage_type_conflict **)((long)local_b0.super_QVLABaseBase.ptr + 8);
        needle0_00.m_data = (storage_type_conflict *)pQVar15;
        needle0_00.m_size = 1;
        qVar8 = QtPrivate::findString(*local_b0.super_QVLABaseBase.ptr,0,needle0_00,CaseSensitive);
        iVar12 = (int)pQVar15;
        if (qVar8 == -1) {
          uVar20 = 0xffffffff;
LAB_0034679a:
          lVar2 = *(qsizetype *)local_b0.super_QVLABaseBase.ptr;
          psVar17 = *(storage_type_conflict **)((long)local_b0.super_QVLABaseBase.ptr + 8);
          QVLABase<QStringView>::erase
                    (&local_b0,(const_iterator)local_b0.super_QVLABaseBase.ptr,
                     (const_iterator)((long)local_b0.super_QVLABaseBase.ptr + 0x10));
          if (((local_b0.super_QVLABaseBase.s == 0) && ((lVar2 == 3 || (lVar2 == 5)))) &&
             ((sVar1 = *psVar17, sVar1 == L'-' || (sVar1 == L'+')))) {
            string_01.m_data = (storage_type_conflict *)&local_109;
            string_01.m_size = (qsizetype)(psVar17 + 1);
            qVar9 = QString::toIntegral_helper((QString *)0x2,string_01,(bool *)0xa,iVar12);
            if ((int)qVar9 == qVar9) {
              uVar11 = 0;
              uVar13 = 0xffffffff;
              if ((local_109 & 1) != 0) {
                if (((lVar2 == 5) &&
                    (string_02.m_data = (storage_type_conflict *)&local_109,
                    string_02.m_size = (qsizetype)(psVar17 + 3),
                    uVar11 = QString::toIntegral_helper((QString *)0x2,string_02,(bool *)0xa,iVar12)
                    , (long)(int)uVar11 != uVar11)) || ((local_109 & 1) == 0)) goto LAB_003467c6;
                iVar12 = (int)uVar11 + (int)qVar9 * 0x3c;
                uVar13 = iVar12 * -0x3c;
                if (sVar1 != L'-') {
                  uVar13 = iVar12 * 0x3c;
                }
                uVar11 = (ulong)uVar13 << 0x20;
                QVar18.jd = lVar14;
                uVar13 = uVar20;
              }
              goto LAB_003467c9;
            }
          }
        }
        else {
          QVLABase<QStringView>::erase
                    (&local_b0,(const_iterator)pvVar3,(const_iterator)((long)pvVar3 + 0x10));
          if ((4 < lVar2) && (psVar17[2] == L':')) {
            if (lVar2 == 8) {
              if (psVar17[5] == L':') {
LAB_003468eb:
                string_03.m_data = (storage_type_conflict *)&local_109;
                string_03.m_size = (qsizetype)psVar17;
                qVar9 = QString::toIntegral_helper((QString *)0x2,string_03,(bool *)0xa,iVar12);
                if ((int)qVar9 == qVar9) {
                  if ((local_109 & 1) != 0) {
                    string_04.m_data = (storage_type_conflict *)&local_109;
                    string_04.m_size = (qsizetype)(psVar17 + 3);
                    qVar10 = QString::toIntegral_helper((QString *)0x2,string_04,(bool *)0xa,iVar12)
                    ;
                    if ((int)qVar10 != qVar10) goto LAB_003469cf;
                    uVar11 = 0;
                    uVar13 = 0xffffffff;
                    if ((local_109 & 1) == 0) goto LAB_003467c9;
                    if (((lVar2 != 8) ||
                        (string_05.m_data = (storage_type_conflict *)&local_109,
                        string_05.m_size = (qsizetype)(psVar17 + 6),
                        uVar11 = QString::toIntegral_helper
                                           ((QString *)0x2,string_05,(bool *)0xa,iVar12),
                        (long)(int)uVar11 == uVar11)) && ((local_109 & 1) != 0)) {
                      iVar12 = 0;
                      QTime::QTime((QTime *)&local_118,(int)qVar9,(int)qVar10,(int)uVar11,0);
                      uVar20 = CONCAT22(local_118.jd._2_2_,(undefined2)local_118.jd);
                      uVar13 = uVar20;
                      if (local_b0.super_QVLABaseBase.s == 0) goto LAB_003469c3;
                      goto LAB_0034679a;
                    }
                  }
                }
                else {
LAB_003469cf:
                  local_109 = 0;
                }
              }
            }
            else if (lVar2 == 5) goto LAB_003468eb;
          }
        }
      }
      goto LAB_003467c6;
    }
  }
LAB_003467c9:
  uVar16 = (ulong)uVar13;
LAB_003467cc:
  if ((QStringView *)local_b0.super_QVLABaseBase.ptr != &local_98) {
    QtPrivate::sizedFree(local_b0.super_QVLABaseBase.ptr,local_b0.super_QVLABaseBase.a << 4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  PVar21.time.mds = (int)(uVar11 | uVar16);
  PVar21.utcOffset = (int)((uVar11 | uVar16) >> 0x20);
  PVar21.date.jd = QVar18.jd;
  return PVar21;
}

Assistant:

static ParsedRfcDateTime rfcDateImpl(QStringView s)
{
    // Matches "[ddd,] dd MMM yyyy[ hh:mm[:ss]] [±hhmm]" - correct RFC 822, 2822, 5322 format -
    // or           "ddd MMM dd[ hh:mm:ss] yyyy [±hhmm]" - permissive RFC 850, 1036 (read only)
    ParsedRfcDateTime result;

    QVarLengthArray<QStringView, 6> words;

    auto tokens = s.tokenize(u' ', Qt::SkipEmptyParts);
    auto it = tokens.begin();
    for (int i = 0; i < 6 && it != tokens.end(); ++i, ++it)
        words.emplace_back(*it);

    if (words.size() < 3 || it != tokens.end())
        return result;
    const QChar colon(u':');
    bool ok = true;
    QDate date;

    const auto isShortName = [](QStringView name) {
        return (name.size() == 3 && name[0].isUpper()
                && name[1].isLower() && name[2].isLower());
    };

    /* Reject entirely (return) if the string is malformed; however, if the date
     * is merely invalid, (break, so as to) go on to parsing of the time.
     */
    int yearIndex;
    do { // "loop" so that we can use break on merely invalid, but "right shape" date.
        QStringView dayName;
        bool rfcX22 = true;
        const QStringView maybeDayName = words.front();
        if (maybeDayName.endsWith(u',')) {
            dayName = maybeDayName.chopped(1);
            words.erase(words.begin());
        } else if (!maybeDayName.front().isDigit()) {
            dayName = maybeDayName;
            words.erase(words.begin());
            rfcX22 = false;
        } // else: dayName is not specified (so we can only be RFC *22)
        if (words.size() < 3 || words.size() > 5)
            return result;

        // Don't break before setting yearIndex.
        int dayIndex, monthIndex;
        if (rfcX22) {
            // dd MMM yyyy [hh:mm[:ss]] [±hhmm]
            dayIndex = 0;
            monthIndex = 1;
            yearIndex = 2;
        } else {
            // MMM dd[ hh:mm:ss] yyyy [±hhmm]
            dayIndex = 1;
            monthIndex = 0;
            yearIndex = words.size() > 3 && words.at(2).contains(colon) ? 3 : 2;
        }

        int dayOfWeek = 0;
        if (!dayName.isEmpty()) {
            if (!isShortName(dayName))
                return result;
            dayOfWeek = shortDayFromName(dayName);
            if (!dayOfWeek)
                break;
        }

        const int day = words.at(dayIndex).toInt(&ok);
        if (!ok)
            return result;
        const int year = words.at(yearIndex).toInt(&ok);
        if (!ok)
            return result;
        const QStringView monthName = words.at(monthIndex);
        if (!isShortName(monthName))
            return result;
        int month = fromShortMonthName(monthName);
        if (month < 0)
            break;

        date = QDate(year, month, day);
        if (dayOfWeek && date.dayOfWeek() != dayOfWeek)
            date = QDate();
    } while (false);
    words.remove(yearIndex);
    words.remove(0, 2); // month and day-of-month, in some order

    // Time: [hh:mm[:ss]]
    QTime time;
    if (words.size() && words.at(0).contains(colon)) {
        const QStringView when = words.front();
        words.erase(words.begin());
        if (when.size() < 5 || when[2] != colon
            || (when.size() == 8 ? when[5] != colon : when.size() > 5)) {
            return result;
        }
        const int hour = when.first(2).toInt(&ok);
        if (!ok)
            return result;
        const int minute = when.sliced(3, 2).toInt(&ok);
        if (!ok)
            return result;
        const auto secs = when.size() == 8 ? when.last(2).toInt(&ok) : 0;
        if (!ok)
            return result;
        time = QTime(hour, minute, secs);
    }

    // Offset: [±hh[mm]]
    int offset = 0;
    if (words.size()) {
        const QStringView zone = words.front();
        words.erase(words.begin());
        if (words.size() || !(zone.size() == 3 || zone.size() == 5))
            return result;
        bool negate = false;
        if (zone[0] == u'-')
            negate = true;
        else if (zone[0] != u'+')
            return result;
        const int hour = zone.sliced(1, 2).toInt(&ok);
        if (!ok)
            return result;
        const auto minute = zone.size() == 5 ? zone.last(2).toInt(&ok) : 0;
        if (!ok)
            return result;
        offset = (hour * 60 + minute) * 60;
        if (negate)
            offset = -offset;
    }

    result.date = date;
    result.time = time;
    result.utcOffset = offset;
    return result;
}